

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_operhlp.c
# Opt level: O0

CURLcode urlerr_cvt(CURLUcode ucode)

{
  undefined4 local_c;
  CURLUcode ucode_local;
  
  if (ucode == CURLUE_OUT_OF_MEMORY) {
    local_c = CURLE_OUT_OF_MEMORY;
  }
  else if (ucode == CURLUE_UNSUPPORTED_SCHEME) {
    local_c = CURLE_UNSUPPORTED_PROTOCOL;
  }
  else if (ucode == CURLUE_LACKS_IDN) {
    local_c = CURLE_NOT_BUILT_IN;
  }
  else if (ucode == CURLUE_BAD_HANDLE) {
    local_c = CURLE_BAD_FUNCTION_ARGUMENT;
  }
  else {
    local_c = CURLE_URL_MALFORMAT;
  }
  return local_c;
}

Assistant:

CURLcode urlerr_cvt(CURLUcode ucode)
{
  if(ucode == CURLUE_OUT_OF_MEMORY)
    return CURLE_OUT_OF_MEMORY;
  else if(ucode == CURLUE_UNSUPPORTED_SCHEME)
    return CURLE_UNSUPPORTED_PROTOCOL;
  else if(ucode == CURLUE_LACKS_IDN)
    return CURLE_NOT_BUILT_IN;
  else if(ucode == CURLUE_BAD_HANDLE)
    return CURLE_BAD_FUNCTION_ARGUMENT;
  return CURLE_URL_MALFORMAT;
}